

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase63::TestCase63(TestCase63 *this)

{
  TestCase63 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0x3f,"legacy test: SchemaParser/Basic");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00cbfa70;
  return;
}

Assistant:

TEST(SchemaParser, Basic) {
  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("src/foo/bar.capnp",
      "@0x8123456789abcdef;\n"
      "struct Bar {\n"
      "  baz @0: import \"baz.capnp\".Baz;\n"
      "  corge @1: import \"../qux/corge.capnp\".Corge;\n"
      "  grault @2: import \"/grault.capnp\".Grault;\n"
      "  garply @3: import \"/garply.capnp\".Garply;\n"
      "}\n");
  reader.add("src/foo/baz.capnp",
      "@0x823456789abcdef1;\n"
      "struct Baz {}\n");
  reader.add("src/qux/corge.capnp",
      "@0x83456789abcdef12;\n"
      "struct Corge {}\n");
  reader.add(ABS("usr/include/grault.capnp"),
      "@0x8456789abcdef123;\n"
      "struct Grault {}\n");
  reader.add(ABS("opt/include/grault.capnp"),
      "@0x8000000000000001;\n"
      "struct WrongGrault {}\n");
  reader.add(ABS("usr/local/include/garply.capnp"),
      "@0x856789abcdef1234;\n"
      "struct Garply {}\n");

  kj::StringPtr importPath[] = {
    ABS("usr/include"), ABS("usr/local/include"), ABS("opt/include")
  };

  ParsedSchema barSchema = parser.parseDiskFile(
      "foo2/bar2.capnp", "src/foo/bar.capnp", importPath);

  auto barProto = barSchema.getProto();
  EXPECT_EQ(0x8123456789abcdefull, barProto.getId());
  EXPECT_EQ("foo2/bar2.capnp", barProto.getDisplayName());

  auto barStruct = barSchema.getNested("Bar");
  auto barFields = barStruct.asStruct().getFields();
  ASSERT_EQ(4u, barFields.size());
  EXPECT_EQ("baz", barFields[0].getProto().getName());
  EXPECT_EQ(0x823456789abcdef1ull, getFieldTypeFileId(barFields[0]));
  EXPECT_EQ("corge", barFields[1].getProto().getName());
  EXPECT_EQ(0x83456789abcdef12ull, getFieldTypeFileId(barFields[1]));
  EXPECT_EQ("grault", barFields[2].getProto().getName());
  EXPECT_EQ(0x8456789abcdef123ull, getFieldTypeFileId(barFields[2]));
  EXPECT_EQ("garply", barFields[3].getProto().getName());
  EXPECT_EQ(0x856789abcdef1234ull, getFieldTypeFileId(barFields[3]));

  auto bazSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/foo/baz.capnp", importPath);
  EXPECT_EQ(0x823456789abcdef1ull, bazSchema.getProto().getId());
  EXPECT_EQ("foo2/baz.capnp", bazSchema.getProto().getDisplayName());
  auto bazStruct = bazSchema.getNested("Baz").asStruct();
  EXPECT_EQ(bazStruct, barStruct.getDependency(bazStruct.getProto().getId()));

  auto corgeSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/qux/corge.capnp", importPath);
  EXPECT_EQ(0x83456789abcdef12ull, corgeSchema.getProto().getId());
  EXPECT_EQ("qux/corge.capnp", corgeSchema.getProto().getDisplayName());
  auto corgeStruct = corgeSchema.getNested("Corge").asStruct();
  EXPECT_EQ(corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId()));

  auto graultSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      ABS("usr/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8456789abcdef123ull, graultSchema.getProto().getId());
  EXPECT_EQ("grault.capnp", graultSchema.getProto().getDisplayName());
  auto graultStruct = graultSchema.getNested("Grault").asStruct();
  EXPECT_EQ(graultStruct, barStruct.getDependency(graultStruct.getProto().getId()));

  // Try importing the other grault.capnp directly.  It'll get the display name we specify since
  // it wasn't imported before.
  auto wrongGraultSchema = parser.parseDiskFile(
      "weird/display/name.capnp",
      ABS("opt/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8000000000000001ull, wrongGraultSchema.getProto().getId());
  EXPECT_EQ("weird/display/name.capnp", wrongGraultSchema.getProto().getDisplayName());
}